

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

int run_test_fs_event_start_and_close(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  undefined1 local_120 [4];
  int r;
  uv_fs_event_t fs_event2;
  uv_fs_event_t fs_event1;
  uv_loop_t *loop;
  
  uVar2 = uv_default_loop();
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(uVar2,&fs_event2.wd);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x3d4,"r == 0");
    abort();
  }
  iVar1 = uv_fs_event_start(&fs_event2.wd,fs_event_cb_dir,"watch_dir",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x3d6,"r == 0");
    abort();
  }
  iVar1 = uv_fs_event_init(uVar2,local_120);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x3d9,"r == 0");
    abort();
  }
  iVar1 = uv_fs_event_start(local_120,fs_event_cb_dir,"watch_dir",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x3db,"r == 0");
    abort();
  }
  uv_close(local_120,close_cb);
  uv_close(&fs_event2.wd,close_cb);
  uv_run(uVar2,0);
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x3e2,"close_cb_called == 2");
    abort();
  }
  remove("watch_dir/");
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x3e5,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_event_start_and_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  uv_fs_event_t fs_event1;
  uv_fs_event_t fs_event2;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event1);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event1, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  r = uv_fs_event_init(loop, &fs_event2);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event2, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) &fs_event2, close_cb);
  uv_close((uv_handle_t*) &fs_event1, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}